

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::is_not_null<double*>(double **value,LocationInfo *location)

{
  FailedAssertion *this;
  allocator local_39;
  string local_38 [32];
  LocationInfo *local_18;
  LocationInfo *location_local;
  double **value_local;
  
  if (*value == (double *)0x0) {
    local_18 = location;
    location_local = (LocationInfo *)value;
    this = (FailedAssertion *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Value is null!",&local_39);
    FailedAssertion::FailedAssertion(this,(string *)local_38,local_18);
    __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  return;
}

Assistant:

inline void is_not_null(const T &value, const LocationInfo &location)
	{
		if (!(value != NULL))
			throw FailedAssertion("Value is null!", location);
	}